

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex9.cpp
# Opt level: O1

void func_free(void)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined4 *puVar3;
  ostream *poVar4;
  int *three;
  int *two;
  int *one;
  
  puVar1 = (undefined4 *)operator_new(4);
  *puVar1 = 100;
  puVar2 = (undefined4 *)operator_new(4);
  *puVar2 = 200;
  puVar3 = (undefined4 *)operator_new(4);
  *puVar3 = 300;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nMemory addresses on heap:",0x1a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n&one=",6);
  poVar4 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n&two=",6);
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n&three=",8);
  poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (puVar1 != (undefined4 *)0x0) {
    operator_delete(puVar1,4);
  }
  if (puVar2 != (undefined4 *)0x0) {
    operator_delete(puVar2,4);
  }
  if (puVar3 != (undefined4 *)0x0) {
    operator_delete(puVar3,4);
  }
  return;
}

Assistant:

void func_free()
{
	int* one = new int;
	*one = 100;
	int* two = new int;
	*two = 200;
	int* three = new int;
	*three = 300;

	std::cout << "\nMemory addresses on heap:"
		<< "\n&one=" << &one
		<< "\n&two=" << &two
		<< "\n&three=" << &three
		<< std::endl;

	delete one;
	delete two;
	delete three;
}